

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

void __thiscall
embree::SceneGraph::PerspectiveCameraNode::print
          (PerspectiveCameraNode *this,ostream *cout,int depth)

{
  string *__lhs;
  bool bVar1;
  ostream *poVar2;
  int n;
  
  poVar2 = std::operator<<(cout,"PerspectiveCameraNode @ ");
  poVar2 = std::ostream::_M_insert<void_const*>(poVar2);
  poVar2 = std::operator<<(poVar2," { ");
  std::endl<char,std::char_traits<char>>(poVar2);
  __lhs = &(this->super_Node).name;
  bVar1 = std::operator!=(__lhs,"");
  n = depth + 1;
  if (bVar1) {
    tab(cout,n);
    poVar2 = std::operator<<(cout,"name = ");
    poVar2 = std::operator<<(poVar2,(string *)__lhs);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  tab(cout,n);
  poVar2 = std::operator<<(cout,"from = ");
  poVar2 = std::operator<<(poVar2,"(");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->data).from.field_0.m128[0]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->data).from.field_0.m128[1]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->data).from.field_0.m128[2]);
  poVar2 = std::operator<<(poVar2,")");
  std::endl<char,std::char_traits<char>>(poVar2);
  tab(cout,n);
  poVar2 = std::operator<<(cout,"to   = ");
  poVar2 = std::operator<<(poVar2,"(");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->data).to.field_0.m128[0]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->data).to.field_0.m128[1]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->data).to.field_0.m128[2]);
  poVar2 = std::operator<<(poVar2,")");
  std::endl<char,std::char_traits<char>>(poVar2);
  tab(cout,n);
  poVar2 = std::operator<<(cout,"up   = ");
  poVar2 = std::operator<<(poVar2,"(");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->data).up.field_0.m128[0]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->data).up.field_0.m128[1]);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->data).up.field_0.m128[2]);
  poVar2 = std::operator<<(poVar2,")");
  std::endl<char,std::char_traits<char>>(poVar2);
  tab(cout,n);
  poVar2 = std::operator<<(cout,"fov  = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->data).fov);
  std::endl<char,std::char_traits<char>>(poVar2);
  tab(cout,depth);
  poVar2 = std::operator<<(cout,"}");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void SceneGraph::PerspectiveCameraNode::print(std::ostream& cout, int depth) {
    cout << "PerspectiveCameraNode @ " << this << " { " << std::endl;
    if (name != "") {
      tab(cout, depth+1); cout << "name = " << name << std::endl;
    }
    tab(cout, depth+1); cout << "from = " << data.from << std::endl;
    tab(cout, depth+1); cout << "to   = " << data.to   << std::endl;
    tab(cout, depth+1); cout << "up   = " << data.up   << std::endl;
    tab(cout, depth+1); cout << "fov  = " << data.fov  << std::endl;
    tab(cout, depth); cout << "}" << std::endl;
  }